

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RedirectedStdErr::RedirectedStdErr(RedirectedStdErr *this)

{
  ostream *poVar1;
  long lVar2;
  
  ReusableStringStream::ReusableStringStream(&this->m_rss);
  poVar1 = (this->m_rss).m_oss;
  (this->m_cerr).m_originalStream = (ostream *)&std::cerr;
  (this->m_cerr).m_redirectionStream = poVar1;
  lVar2 = std::cerr;
  (this->m_cerr).m_prevBuf = *(streambuf **)(*(long *)(std::cerr + -0x18) + 0x1b5760);
  std::ios::rdbuf((streambuf *)((long)&std::cerr + *(long *)(lVar2 + -0x18)));
  poVar1 = (this->m_rss).m_oss;
  (this->m_clog).m_originalStream = (ostream *)&std::clog;
  (this->m_clog).m_redirectionStream = poVar1;
  lVar2 = std::clog;
  (this->m_clog).m_prevBuf = *(streambuf **)(vsnprintf + *(long *)(std::clog + -0x18));
  std::ios::rdbuf((streambuf *)((long)&std::clog + *(long *)(lVar2 + -0x18)));
  return;
}

Assistant:

RedirectedStdErr::RedirectedStdErr()
    :   m_cerr( Catch::cerr(), m_rss.get() ),
        m_clog( Catch::clog(), m_rss.get() )
    {}